

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer *ppTVar1;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *paVar2;
  uint uVar3;
  string *psVar4;
  XML *this_00;
  pointer pVVar5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  bool bVar8;
  TriangleMeshNode *this_01;
  size_t in_RCX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  iterator __position;
  uchar *in_R8;
  size_t in_R9;
  long lVar9;
  ulong uVar10;
  Ref<embree::XML> animation;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> triangles;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  string local_a8;
  undefined8 *local_88;
  _Alloc_hider local_80;
  undefined1 local_78 [40];
  Ref<embree::SceneGraph::MaterialNode> local_50;
  _Alloc_hider local_48;
  _Base_ptr local_40;
  undefined8 local_38;
  
  psVar4 = (string *)*in_RDX;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88 = in_RDX;
  local_80._M_p = (pointer)xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"material","");
  XML::child((XML *)local_78,psVar4);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffb8,(Ref<embree::XML> *)local_80._M_p);
  if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ !=
      (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this_01 = (TriangleMeshNode *)operator_new(0xd8);
  local_50.ptr = (MaterialNode *)local_48._M_p;
  if ((long *)local_48._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_p + 0x10))(local_48._M_p);
  }
  local_40 = (_Base_ptr)local_48._M_p;
  SceneGraph::TriangleMeshNode::TriangleMeshNode(this_01,&local_50,(BBox1f)0x3f80000000000000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  local_38 = this;
  if (local_50.ptr != (MaterialNode *)0x0) {
    (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  psVar4 = (string *)*local_88;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_positions","");
  XML::childOpt((XML *)&local_b0,psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_b0.ptr == (XML *)0x0) {
    psVar4 = (string *)*local_88;
    paVar2 = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_78 + 0x10);
    local_78._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"positions","");
    XML::childOpt((XML *)(local_78 + 0x20),psVar4);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_80._M_p,
                    (Ref<embree::XML> *)(local_78 + 0x20));
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this_01->positions,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a8);
    alignedFree((void *)local_a8.field_2._8_8_);
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = (void *)0x0;
    if ((long *)local_78._32_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_78._32_8_ + 0x18))();
    }
    if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ != paVar2) {
      operator_delete((void *)local_78._0_8_);
    }
    this_00 = (XML *)*local_88;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"positions2","");
    bVar8 = XML::hasChild(this_00,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (bVar8) {
      psVar4 = (string *)*local_88;
      local_78._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"positions2","");
      XML::childOpt((XML *)(local_78 + 0x20),psVar4);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_80._M_p,
                      (Ref<embree::XML> *)(local_78 + 0x20));
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_01->positions,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((long *)local_78._32_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_78._32_8_ + 0x18))();
      }
      if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ != paVar2) {
        operator_delete((void *)local_78._0_8_);
      }
    }
  }
  else if (((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           ((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      XML::child((XML *)local_78,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_80._M_p,
                      (Ref<embree::XML> *)local_78);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_01->positions,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ !=
          (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
        (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ + 0x18))();
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)((local_b0.ptr)->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)((local_b0.ptr)->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  psVar4 = (string *)*local_88;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_normals","");
  XML::childOpt((XML *)local_78,psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ ==
      (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    psVar4 = (string *)*local_88;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normals","");
    XML::childOpt((XML *)&local_b0,psVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_80._M_p,&local_b0);
      if (((element_type *)local_a8._M_string_length != (element_type *)0x0) &&
         ((this_01->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        uVar10 = 0;
        do {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(&this_01->normals,(value_type *)&local_a8);
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)(this_01->positions).
                                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_01->positions).
                                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      alignedFree((void *)local_a8.field_2._8_8_);
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ ==
        (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) goto LAB_0017fb0c;
  }
  else if (*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_78._0_8_ + 0x88) !=
           *(anon_union_8_2_4062524c_for_Vec2<float>_1 *)(local_78._0_8_ + 0x80)) {
    uVar10 = 0;
    do {
      XML::child((XML *)&local_b0,local_78._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)local_80._M_p,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_01->normals,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)
                                     (local_78._0_8_ + 0x88) -
                              (long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)
                                     (local_78._0_8_ + 0x80) >> 3));
  }
  (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_78._0_8_ + 0x18))
            (local_78._0_8_);
LAB_0017fb0c:
  psVar4 = (string *)*local_88;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoords","");
  XML::childOpt((XML *)&local_b0,psVar4);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_78,
                 (XMLLoader *)local_80._M_p,&local_b0);
  pVVar5 = (this_01->texcoords).
           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this_01->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  (this_01->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  (this_01->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = (element_type *)0x0;
  if ((pVVar5 != (pointer)0x0) && (operator_delete(pVVar5), (pointer)local_78._0_8_ != (pointer)0x0)
     ) {
    operator_delete((void *)local_78._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar4 = (string *)*local_88;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"triangles","");
  XML::childOpt((XML *)&local_b0,psVar4);
  __position._M_current = (Triangle *)local_80._M_p;
  loadVec3iArray((vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *)local_78,
                 (XMLLoader *)local_80._M_p,&local_b0);
  sig = extraout_RDX;
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    sig = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
    sig = extraout_RDX_01;
  }
  if (local_78._8_8_ != local_78._0_8_) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      uVar3 = *(uint *)((long)(anon_union_12_2_4062524c_for_Vec3<int>_1 *)local_78._0_8_ + lVar9);
      local_a8._M_dataplus._M_p = *(pointer *)(local_78._0_8_ + lVar9 + -8);
      local_a8._M_string_length = CONCAT44(local_a8._M_string_length._4_4_,uVar3);
      __position._M_current =
           (this_01->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_01->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (&this_01->triangles,__position,(Triangle *)&local_a8);
        sig = extraout_RDX_02;
      }
      else {
        (__position._M_current)->v2 = uVar3;
        *(pointer *)__position._M_current = local_a8._M_dataplus._M_p;
        ppTVar1 = &(this_01->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      uVar10 = uVar10 + 1;
      in_RCX = ((long)(local_78._8_8_ - local_78._0_8_) >> 2) * -0x5555555555555555;
      lVar9 = lVar9 + 0xc;
    } while (uVar10 < in_RCX);
  }
  SceneGraph::TriangleMeshNode::verify
            (this_01,(EVP_PKEY_CTX *)__position._M_current,sig,in_RCX,in_R8,in_R9);
  uVar7 = local_38;
  *(TriangleMeshNode **)local_38 = this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  p_Var6 = local_40;
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  if (p_Var6 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)&p_Var6->_M_color + 0x18))(p_Var6);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)uVar7;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec3i> triangles = loadVec3iArray(xml->childOpt("triangles"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }